

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int sort_5_3::shell_sort_1(int *a,int n,int gap)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int i;
  ulong uVar6;
  uint uVar7;
  
  uVar4 = (ulong)(uint)n;
  do {
    uVar2 = (long)(int)uVar4 / (long)gap;
    uVar4 = uVar2 & 0xffffffff;
    uVar5 = 0;
    for (uVar6 = uVar4; (long)uVar6 < (long)n; uVar6 = uVar6 + 1) {
      iVar1 = a[uVar6];
      uVar7 = uVar5;
      while( true ) {
        iVar3 = (int)uVar2;
        if (((int)uVar7 < 0) || (a[uVar7] <= iVar1)) break;
        a[iVar3 + uVar7] = a[uVar7];
        uVar7 = uVar7 - iVar3;
      }
      a[(int)(uVar7 + iVar3)] = iVar1;
      uVar5 = uVar5 + 1;
    }
  } while( true );
}

Assistant:

int shell_sort_1(int *a, int n, int gap = 2) {
        int j, g = n / gap, t;
        while (g > 0) {
            for (int i = g; i < n; i++) {
                t = a[i];
                for (j = i - g; j >= 0 && a[j] > t; j -= g) {
                    a[j + g] = a[j];
                }
                a[j + g] = t;
            }
            g /= gap;
        }
    }